

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O3

void png_check_chunk_length(png_const_structrp png_ptr,png_uint_32 length)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  long lVar3;
  png_alloc_size_t pVar4;
  long lVar5;
  ulong uVar6;
  
  pVar4 = png_ptr->user_chunk_malloc_max;
  if (0x7ffffffd < pVar4 - 1) {
    pVar4 = 0x7fffffff;
  }
  if (png_ptr->chunk_name == 0x49444154) {
    lVar3 = (ulong)png_ptr->channels * (ulong)png_ptr->width << (8 < png_ptr->bit_depth);
    lVar5 = lVar3 + 6;
    if (png_ptr->interlaced == '\0') {
      lVar5 = lVar3;
    }
    uVar6 = lVar5 + 1;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar6;
    uVar2 = png_ptr->height * uVar6;
    if (SUB164((ZEXT816(0) << 0x40 | ZEXT816(0xffffffff)) / auVar1,0) < png_ptr->height) {
      uVar2 = 0x7fffffff;
    }
    if (0x7f35 < uVar6) {
      uVar6 = 0x7f36;
    }
    uVar6 = (uVar2 / uVar6) * 5 + uVar2 + 0xb;
    uVar2 = 0x7fffffff;
    if (uVar6 < 0x7fffffff) {
      uVar2 = uVar6;
    }
    if (pVar4 <= uVar2) {
      pVar4 = uVar2;
    }
  }
  if (length <= pVar4) {
    return;
  }
  png_chunk_error(png_ptr,"chunk data is too large");
}

Assistant:

void /* PRIVATE */
png_check_chunk_length(png_const_structrp png_ptr, png_uint_32 length)
{
   png_alloc_size_t limit = PNG_UINT_31_MAX;

# ifdef PNG_SET_USER_LIMITS_SUPPORTED
   if (png_ptr->user_chunk_malloc_max > 0 &&
       png_ptr->user_chunk_malloc_max < limit)
      limit = png_ptr->user_chunk_malloc_max;
# elif PNG_USER_CHUNK_MALLOC_MAX > 0
   if (PNG_USER_CHUNK_MALLOC_MAX < limit)
      limit = PNG_USER_CHUNK_MALLOC_MAX;
# endif
   if (png_ptr->chunk_name == png_IDAT)
   {
      png_alloc_size_t idat_limit = PNG_UINT_31_MAX;
      size_t row_factor =
         (size_t)png_ptr->width
         * (size_t)png_ptr->channels
         * (png_ptr->bit_depth > 8? 2: 1)
         + 1
         + (png_ptr->interlaced? 6: 0);
      if (png_ptr->height > PNG_UINT_32_MAX/row_factor)
         idat_limit = PNG_UINT_31_MAX;
      else
         idat_limit = png_ptr->height * row_factor;
      row_factor = row_factor > 32566? 32566 : row_factor;
      idat_limit += 6 + 5*(idat_limit/row_factor+1); /* zlib+deflate overhead */
      idat_limit=idat_limit < PNG_UINT_31_MAX? idat_limit : PNG_UINT_31_MAX;
      limit = limit < idat_limit? idat_limit : limit;
   }

   if (length > limit)
   {
      png_debug2(0," length = %lu, limit = %lu",
         (unsigned long)length,(unsigned long)limit);
      png_chunk_error(png_ptr, "chunk data is too large");
   }
}